

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::set_dht_settings(session_impl *this,dht_settings *settings)

{
  session_settings *this_00;
  mutex *pmVar1;
  int iVar2;
  unique_lock<std::mutex> local_40;
  
  this_00 = &this->m_settings;
  iVar2 = settings->max_peers_reply;
  pmVar1 = &(this->m_settings).m_mutex;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x89] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->search_branching;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8a] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_fail_count;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8b] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_torrents;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8c] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_dht_items;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8d] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_peers;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8e] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_torrent_search_reply;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x8f] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  session_settings::set_bool(this_00,0x8046,settings->restrict_routing_ips);
  session_settings::set_bool(this_00,0x8047,settings->restrict_search_ips);
  session_settings::set_bool(this_00,0x8048,settings->extended_routing_table);
  session_settings::set_bool(this_00,0x8049,settings->aggressive_lookups);
  session_settings::set_bool(this_00,0x804a,settings->privacy_lookups);
  session_settings::set_bool(this_00,0x804b,settings->enforce_node_id);
  session_settings::set_bool(this_00,0x804c,settings->ignore_dark_internet);
  iVar2 = settings->block_timeout;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x90] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->block_ratelimit;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x91] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  session_settings::set_bool(this_00,0x804d,settings->read_only);
  iVar2 = settings->item_lifetime;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x92] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->upload_rate_limit;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x52] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->sample_infohashes_interval;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x93] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  iVar2 = settings->max_infohashes_sample_count;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (this->m_settings).m_store.m_ints._M_elems[0x94] = iVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  update_dht_upload_rate_limit(this);
  return;
}

Assistant:

void session_impl::set_dht_settings(dht::dht_settings const& settings)
	{
#define SET_BOOL(name) m_settings.set_bool(settings_pack::dht_ ## name, settings.name)
#define SET_INT(name) m_settings.set_int(settings_pack::dht_ ## name, settings.name)

		SET_INT(max_peers_reply);
		SET_INT(search_branching);
		SET_INT(max_fail_count);
		SET_INT(max_torrents);
		SET_INT(max_dht_items);
		SET_INT(max_peers);
		SET_INT(max_torrent_search_reply);
		SET_BOOL(restrict_routing_ips);
		SET_BOOL(restrict_search_ips);
		SET_BOOL(extended_routing_table);
		SET_BOOL(aggressive_lookups);
		SET_BOOL(privacy_lookups);
		SET_BOOL(enforce_node_id);
		SET_BOOL(ignore_dark_internet);
		SET_INT(block_timeout);
		SET_INT(block_ratelimit);
		SET_BOOL(read_only);
		SET_INT(item_lifetime);
		SET_INT(upload_rate_limit);
		SET_INT(sample_infohashes_interval);
		SET_INT(max_infohashes_sample_count);
#undef SET_BOOL
#undef SET_INT
		update_dht_upload_rate_limit();
	}